

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::Value::free(Value *this,void *__ptr)

{
  unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
  *this_00;
  Value *this_local;
  
  if (this->type == Array) {
    ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::clear
              (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>);
  }
  else if ((this->type == Object) &&
          (this_00 = (unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
                      *)(this->field_1).arr,
          this_00 !=
          (unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
           *)0x0)) {
    std::
    unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
    ::~unordered_map(this_00);
    operator_delete(this_00,0x38);
  }
  this->type = Null;
  (this->field_1).str.str._M_len = 0;
  return;
}

Assistant:

void free() {
    if (type == Array) {
      arr->clear();
    } else if (type == Object) {
      delete obj;
    }
    type = Null;
    num = 0;
  }